

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_send_client_finished(SSL_HANDSHAKE *hs)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *pSVar1;
  SSL *ssl_00;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  cbb_st *pcVar6;
  uchar *data;
  size_t len;
  undefined1 local_128 [8];
  CBB body_1;
  ScopedCBB cbb_1;
  undefined1 local_b8 [8];
  CBB child;
  CBB body;
  ScopedCBB cbb;
  size_t padding_len;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xff7fffff | 0x800000;
  bVar3 = (*ssl_00->method->add_change_cipher_spec)(ssl_00);
  if ((!bVar3) || (bVar3 = tls1_change_cipher_state(hs,evp_aead_seal), !bVar3)) {
    return ssl_hs_error;
  }
  if ((*(uint *)&hs->field_0x6c8 >> 0xf & 1) != 0) {
    sVar5 = Array<unsigned_char>::size(&ssl_00->s3->next_proto_negotiated);
    pSVar1 = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18);
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(pSVar1);
    p_Var2 = ssl_00->method->init_message;
    pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(pSVar1);
    bVar3 = (*p_Var2)(ssl_00,pcVar6,(CBB *)((long)&child.u + 0x18),'C');
    if ((bVar3) &&
       (iVar4 = CBB_add_u8_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)local_b8),
       iVar4 != 0)) {
      data = Array<unsigned_char>::data(&ssl_00->s3->next_proto_negotiated);
      len = Array<unsigned_char>::size(&ssl_00->s3->next_proto_negotiated);
      iVar4 = CBB_add_bytes((CBB *)local_b8,data,len);
      if ((iVar4 == 0) ||
         ((iVar4 = CBB_add_u8_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)local_b8),
          iVar4 == 0 ||
          (iVar4 = CBB_add_bytes((CBB *)local_b8,"",0x20 - (ulong)((int)sVar5 + 2U & 0x1f)),
          iVar4 == 0)))) goto LAB_0017e5f4;
      pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&body.u + 0x18));
      bVar3 = ssl_add_message_cbb(ssl_00,pcVar6);
      if (!bVar3) goto LAB_0017e5f4;
      bVar3 = false;
    }
    else {
LAB_0017e5f4:
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,0x634);
      hs_local._4_4_ = ssl_hs_error;
      bVar3 = true;
    }
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18));
    if (bVar3) {
      return hs_local._4_4_;
    }
  }
  if ((*(uint *)&hs->field_0x6c8 >> 0x18 & 1) == 0) goto LAB_0017e7e4;
  pSVar1 = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body_1.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(pSVar1);
  p_Var2 = ssl_00->method->init_message;
  pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(pSVar1);
  bVar3 = (*p_Var2)(ssl_00,pcVar6,(CBB *)local_128,0xcb);
  if ((bVar3) && (bVar3 = tls1_write_channel_id(hs,(CBB *)local_128), bVar3)) {
    pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&body_1.u + 0x18));
    bVar3 = ssl_add_message_cbb(ssl_00,pcVar6);
    if (!bVar3) goto LAB_0017e76b;
    bVar3 = false;
  }
  else {
LAB_0017e76b:
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x63f);
    hs_local._4_4_ = ssl_hs_error;
    bVar3 = true;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body_1.u + 0x18));
  if (bVar3) {
    return hs_local._4_4_;
  }
LAB_0017e7e4:
  bVar3 = ssl_send_finished(hs);
  if (bVar3) {
    hs->state = 0x10;
    hs_local._4_4_ = ssl_hs_flush;
  }
  else {
    hs_local._4_4_ = ssl_hs_error;
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_send_client_finished(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  hs->can_release_private_key = true;
  if (!ssl->method->add_change_cipher_spec(ssl) ||
      !tls1_change_cipher_state(hs, evp_aead_seal)) {
    return ssl_hs_error;
  }

  if (hs->next_proto_neg_seen) {
    static const uint8_t kZero[32] = {0};
    size_t padding_len =
        32 - ((ssl->s3->next_proto_negotiated.size() + 2) % 32);

    ScopedCBB cbb;
    CBB body, child;
    if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_NEXT_PROTO) ||
        !CBB_add_u8_length_prefixed(&body, &child) ||
        !CBB_add_bytes(&child, ssl->s3->next_proto_negotiated.data(),
                       ssl->s3->next_proto_negotiated.size()) ||
        !CBB_add_u8_length_prefixed(&body, &child) ||
        !CBB_add_bytes(&child, kZero, padding_len) ||
        !ssl_add_message_cbb(ssl, cbb.get())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return ssl_hs_error;
    }
  }

  if (hs->channel_id_negotiated) {
    ScopedCBB cbb;
    CBB body;
    if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CHANNEL_ID) ||
        !tls1_write_channel_id(hs, &body) ||
        !ssl_add_message_cbb(ssl, cbb.get())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return ssl_hs_error;
    }
  }

  if (!ssl_send_finished(hs)) {
    return ssl_hs_error;
  }

  hs->state = state_finish_flight;
  return ssl_hs_flush;
}